

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2configuration.cpp
# Opt level: O0

void __thiscall QHttp2Configuration::QHttp2Configuration(QHttp2Configuration *this)

{
  QHttp2ConfigurationPrivate *this_00;
  QHttp2ConfigurationPrivate *in_RDI;
  
  this_00 = (QHttp2ConfigurationPrivate *)operator_new(0x18);
  QHttp2ConfigurationPrivate::QHttp2ConfigurationPrivate(this_00);
  QSharedDataPointer<QHttp2ConfigurationPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QHttp2ConfigurationPrivate> *)this_00,in_RDI);
  return;
}

Assistant:

QHttp2Configuration::QHttp2Configuration()
    : d(new QHttp2ConfigurationPrivate)
{
}